

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O2

void __thiscall TimeOffsets::Add(TimeOffsets *this,seconds offset)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  Logger *this_00;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  size_type local_40;
  rep local_38;
  seconds offset_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  offset_local = offset;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/timeoffsets.cpp"
             ,0x18,false);
  this_01 = &this->m_offsets;
  sVar3 = std::
          deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          ::size(this_01);
  if (0x31 < sVar3) {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::pop_front(this_01);
  }
  std::
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::push_back(this_01,&offset_local);
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar2) {
    local_38 = offset_local.__r;
    local_40 = std::
               deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               ::size(this_01);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/timeoffsets.cpp"
    ;
    source_file._M_len = 100;
    logging_function._M_str = "Add";
    logging_function._M_len = 3;
    LogPrintFormatInternal<long,unsigned_long>
              (logging_function,source_file,0x1f,NET,Debug,(ConstevalFormatString<2U>)0xcb6616,
               &local_38,&local_40);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TimeOffsets::Add(std::chrono::seconds offset)
{
    LOCK(m_mutex);

    if (m_offsets.size() >= MAX_SIZE) {
        m_offsets.pop_front();
    }
    m_offsets.push_back(offset);
    LogDebug(BCLog::NET, "Added time offset %+ds, total samples %d\n",
             Ticks<std::chrono::seconds>(offset), m_offsets.size());
}